

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QUuid *id)

{
  long lVar1;
  QDebug *this;
  QString *t;
  QDebugStateSaver *this_00;
  QUuid *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff7f;
  Stream *pSVar2;
  char *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)in_RSI,(QDebug *)in_RDI);
  this = QDebug::nospace((QDebug *)in_RSI);
  t = (QString *)QDebug::operator<<(this,in_stack_ffffffffffffffd8);
  QUuid::toString(in_RSI,(StringFormat)((ulong)pSVar2 >> 0x20));
  this_00 = (QDebugStateSaver *)QDebug::operator<<((QDebug *)in_RDI,t);
  QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff7f);
  QString::~QString((QString *)0x462523);
  QDebug::QDebug((QDebug *)in_RDI,(QDebug *)t);
  QDebugStateSaver::~QDebugStateSaver(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)pSVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QUuid &id)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QUuid(" << id.toString() << ')';
    return dbg;
}